

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

void __thiscall foxxll::config::find_config(config *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  bool local_3c9;
  bool local_3b1;
  bool local_371;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  byte local_2cb;
  byte local_2ca;
  byte local_2c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  allocator local_241;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  undefined1 local_200 [8];
  string basepath_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  int local_19c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  byte local_133;
  byte local_132;
  byte local_131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  string basepath;
  char *suffix;
  char *home;
  char *hostname;
  string local_70 [35];
  byte local_4d;
  byte local_3a;
  allocator local_39;
  string local_38;
  char *local_18;
  char *cfg;
  config *this_local;
  
  cfg = (char *)this;
  pcVar2 = getenv("STXXLCFG");
  local_3a = 0;
  local_4d = 0;
  local_371 = false;
  local_18 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    std::allocator<char>::allocator();
    local_3a = 1;
    std::__cxx11::string::string((string *)&local_38,pcVar2,&local_39);
    local_4d = 1;
    local_371 = exist_file(&local_38);
  }
  if ((local_4d & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_38);
  }
  if ((local_3a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  pcVar2 = local_18;
  if (local_371 == false) {
    pcVar2 = getenv("HOSTNAME");
    pcVar3 = getenv("HOME");
    basepath.field_2._8_8_ = (long)"WARNING: Slow disk(s) detected.\n" + 0x20;
    (*this->_vptr_config[8])();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   "./",&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    local_131 = 0;
    local_132 = 0;
    local_133 = 0;
    local_3b1 = false;
    if (pcVar2 != (char *)0x0) {
      std::operator+(&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     ".");
      local_131 = 1;
      std::operator+(&local_110,&local_130,pcVar2);
      local_132 = 1;
      std::operator+(&local_f0,&local_110,(char *)basepath.field_2._8_8_);
      local_133 = 1;
      local_3b1 = exist_file(&local_f0);
    }
    if ((local_133 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_f0);
    }
    if ((local_132 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_110);
    }
    if ((local_131 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_130);
    }
    if (local_3b1 == false) {
      std::operator+(&local_1c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     (char *)basepath.field_2._8_8_);
      bVar1 = exist_file(&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      if (bVar1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&basepath_1.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0
                       ,(char *)basepath.field_2._8_8_);
        (*this->_vptr_config[4])(this,(undefined1 *)((long)&basepath_1.field_2 + 8));
        std::__cxx11::string::~string((string *)(basepath_1.field_2._M_local_buf + 8));
        local_19c = 1;
      }
      else {
        local_19c = 0;
      }
    }
    else {
      std::operator+(&local_198,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     ".");
      std::operator+(&local_178,&local_198,pcVar2);
      std::operator+(&local_158,&local_178,(char *)basepath.field_2._8_8_);
      (*this->_vptr_config[4])(this,&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_198);
      local_19c = 1;
    }
    std::__cxx11::string::~string((string *)local_b0);
    if (local_19c == 0) {
      if (pcVar3 != (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_240,pcVar3,&local_241);
        std::operator+(&local_220,&local_240,"/");
        (*this->_vptr_config[8])(&local_268);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_200,&local_220,&local_268);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::string::~string((string *)&local_240);
        std::allocator<char>::~allocator((allocator<char> *)&local_241);
        local_2c9 = 0;
        local_2ca = 0;
        local_2cb = 0;
        local_3c9 = false;
        if (pcVar2 != (char *)0x0) {
          std::operator+(&local_2c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_200,".");
          local_2c9 = 1;
          std::operator+(&local_2a8,&local_2c8,pcVar2);
          local_2ca = 1;
          std::operator+(&local_288,&local_2a8,(char *)basepath.field_2._8_8_);
          local_2cb = 1;
          local_3c9 = exist_file(&local_288);
        }
        if ((local_2cb & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_288);
        }
        if ((local_2ca & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_2a8);
        }
        if ((local_2c9 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_2c8);
        }
        if (local_3c9 == false) {
          std::operator+(&local_350,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_200,(char *)basepath.field_2._8_8_);
          bVar1 = exist_file(&local_350);
          std::__cxx11::string::~string((string *)&local_350);
          if (bVar1) {
            std::operator+(&local_370,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_200,(char *)basepath.field_2._8_8_);
            (*this->_vptr_config[4])(this,&local_370);
            std::__cxx11::string::~string((string *)&local_370);
            local_19c = 1;
          }
          else {
            local_19c = 0;
          }
        }
        else {
          std::operator+(&local_330,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_200,".");
          std::operator+(&local_310,&local_330,pcVar2);
          std::operator+(&local_2f0,&local_310,(char *)basepath.field_2._8_8_);
          (*this->_vptr_config[4])(this,&local_2f0);
          std::__cxx11::string::~string((string *)&local_2f0);
          std::__cxx11::string::~string((string *)&local_310);
          std::__cxx11::string::~string((string *)&local_330);
          local_19c = 1;
        }
        std::__cxx11::string::~string((string *)local_200);
        if (local_19c != 0) {
          return;
        }
      }
      (*this->_vptr_config[5])();
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,pcVar2,(allocator *)((long)&hostname + 7));
    (*this->_vptr_config[4])(this,local_70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)((long)&hostname + 7));
  }
  return;
}

Assistant:

void config::find_config()
{
    // check several locations for disk configuration files

    // check STXXLCFG environment path
    const char* cfg = getenv("STXXLCFG");
    if (cfg && exist_file(cfg))
        return load_config_file(cfg);

#if !FOXXLL_WINDOWS
    // read environment, unix style
    const char* hostname = getenv("HOSTNAME");
    const char* home = getenv("HOME");
    const char* suffix = "";
#else
    // read environment, windows style
    const char* hostname = getenv("COMPUTERNAME");
    const char* home = getenv("APPDATA");
    const char* suffix = ".txt";
#endif

    // check current directory
    {
        std::string basepath = "./" + default_config_file_name();

        if (hostname && exist_file(basepath + "." + hostname + suffix))
            return load_config_file(basepath + "." + hostname + suffix);

        if (exist_file(basepath + suffix))
            return load_config_file(basepath + suffix);
    }

    // check home directory
    if (home)
    {
        std::string basepath =
            std::string(home) + "/" + default_config_file_name();

        if (hostname && exist_file(basepath + "." + hostname + suffix))
            return load_config_file(basepath + "." + hostname + suffix);

        if (exist_file(basepath + suffix))
            return load_config_file(basepath + suffix);
    }

    // load default configuration
    load_default_config();
}